

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMPrintErrorHandler.cpp
# Opt level: O2

bool __thiscall DOMPrintErrorHandler::handleError(DOMPrintErrorHandler *this,DOMError *domError)

{
  int iVar1;
  wchar16 *pwVar2;
  ostream *poVar3;
  char *pcVar4;
  char *msg;
  char *local_20;
  
  iVar1 = (**(code **)(*(long *)domError + 0x10))(domError);
  if (iVar1 == 1) {
    pcVar4 = "\nWarning Message: ";
  }
  else {
    iVar1 = (**(code **)(*(long *)domError + 0x10))(domError);
    pcVar4 = "\nFatal Message: ";
    if (iVar1 == 2) {
      pcVar4 = "\nError Message: ";
    }
  }
  std::operator<<((ostream *)&std::cerr,pcVar4);
  pwVar2 = (wchar16 *)(**(code **)(*(long *)domError + 0x18))(domError);
  local_20 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  poVar3 = std::operator<<((ostream *)&std::cerr,local_20);
  std::endl<char,std::char_traits<char>>(poVar3);
  xercesc_4_0::XMLString::release(&local_20,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return true;
}

Assistant:

bool DOMPrintErrorHandler::handleError(const DOMError &domError)
{
    // Display whatever error message passed from the serializer
    if (domError.getSeverity() == DOMError::DOM_SEVERITY_WARNING)
        std::cerr << "\nWarning Message: ";
    else if (domError.getSeverity() == DOMError::DOM_SEVERITY_ERROR)
        std::cerr << "\nError Message: ";
    else
        std::cerr << "\nFatal Message: ";

    char *msg = XMLString::transcode(domError.getMessage());
    std::cerr<< msg <<std::endl;
    XMLString::release(&msg);

    // Instructs the serializer to continue serialization if possible.
    return true;
}